

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_gray(uchar *gray,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  Mat *in_R8;
  undefined8 in_R9;
  bool bVar1;
  int remain;
  int y;
  float *ptr;
  int wgap;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  size_t in_stack_ffffffffffffffa8;
  float *pfVar4;
  int in_stack_ffffffffffffffb4;
  int local_30;
  int local_2c;
  byte *local_28;
  int local_1c;
  
  Mat::create(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,in_stack_ffffffffffffffb4,
              in_stack_ffffffffffffffa8,
              (Allocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar1 = true;
  if (in_R8->data != (void *)0x0) {
    bVar1 = in_R8->cstep * (long)in_R8->c == 0;
  }
  if (bVar1) {
    local_1c = -100;
  }
  else {
    local_30 = in_EDX;
    local_2c = in_ESI;
    if (in_ECX - in_ESI == 0) {
      local_2c = in_ESI * in_EDX;
      local_30 = 1;
    }
    pfVar4 = (float *)in_R8->data;
    local_28 = in_RDI;
    for (iVar3 = 0; iVar2 = local_2c, iVar3 < local_30; iVar3 = iVar3 + 1) {
      for (; 0 < iVar2; iVar2 = iVar2 + -1) {
        *pfVar4 = (float)*local_28;
        local_28 = local_28 + 1;
        pfVar4 = pfVar4 + 1;
      }
      local_28 = local_28 + (in_ECX - in_ESI);
    }
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

static int from_gray(const unsigned char* gray, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 1, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr = m;

    for (int y = 0; y < h; y++)
    {
#if __ARM_NEON
        int nn = w >> 4;
        int remain = w - (nn << 4);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn > 0; nn--)
        {
            uint8x16_t _gray = vld1q_u8(gray);
            uint16x8_t _gray16_0 = vmovl_u8(vget_low_u8(_gray));
            uint16x8_t _gray16_1 = vmovl_u8(vget_high_u8(_gray));

            float32x4_t _graylow_0 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_0)));
            float32x4_t _grayhigh_0 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_0)));
            float32x4_t _graylow_1 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_1)));
            float32x4_t _grayhigh_1 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_1)));

            vst1q_f32(ptr, _graylow_0);
            vst1q_f32(ptr + 4, _grayhigh_0);
            vst1q_f32(ptr + 8, _graylow_1);
            vst1q_f32(ptr + 12, _grayhigh_1);

            gray += 16;
            ptr += 16;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.u8    {d0,d1}, [%1]!      \n"
                "vmovl.u8   q8, d0              \n"
                "vmovl.u8   q9, d1              \n"
                "vmovl.u16  q0, d16             \n"
                "vmovl.u16  q1, d17             \n"
                "vmovl.u16  q2, d18             \n"
                "vmovl.u16  q3, d19             \n"
                "vcvt.f32.u32   q0, q0          \n"
                "vcvt.f32.u32   q1, q1          \n"
                "vcvt.f32.u32   q2, q2          \n"
                "vcvt.f32.u32   q3, q3          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d3}, [%2]!      \n"
                "vst1.f32   {d4-d7}, [%2]!      \n"
                "bne        0b                  \n"
                : "=r"(nn),   // %0
                "=r"(gray), // %1
                "=r"(ptr)   // %2
                : "0"(nn),
                "1"(gray),
                "2"(ptr)
                : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            *ptr = *gray;

            gray++;
            ptr++;
        }

        gray += wgap;
    }

    return 0;
}